

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::EarlyFragmentTestsCase::init
          (EarlyFragmentTestsCase *this,EVP_PKEY_CTX *ctx)

{
  RenderTargetType RVar1;
  ContextInfo *pCVar2;
  bool bVar3;
  int iVar4;
  ContextType ctxType;
  RenderTarget *pRVar5;
  NotSupportedError *pNVar6;
  TestType TVar7;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  pCVar2 = ((this->super_TestCase).m_context)->m_contextInfo;
  iVar4 = (*pCVar2->_vptr_ContextInfo[2])(pCVar2,0x90ce);
  if (iVar4 == 0) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_78,"GL_MAX_FRAGMENT_IMAGE_UNIFORMS is zero",
               (allocator<char> *)&local_58);
    tcu::NotSupportedError::NotSupportedError(pNVar6,&sStack_78);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_OES_shader_image_atomic")
  ;
  if (!bVar3) {
    ctxType.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
    if (!bVar3) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_78,"Test requires OES_shader_image_atomic extension",
                 (allocator<char> *)&local_58);
      tcu::NotSupportedError::NotSupportedError(pNVar6,&sStack_78);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  TVar7 = this->m_type;
  RVar1 = this->m_renderTarget;
  if (RVar1 == RENDERTARGET_DEFAULT && TVar7 == TESTTYPE_DEPTH) {
    pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (pRVar5->m_depthBits == 0) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_78,"Test requires depth buffer",(allocator<char> *)&local_58);
      tcu::NotSupportedError::NotSupportedError(pNVar6,&sStack_78);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    TVar7 = this->m_type;
    RVar1 = this->m_renderTarget;
  }
  if (TVar7 == TESTTYPE_STENCIL && RVar1 == RENDERTARGET_DEFAULT) {
    pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (pRVar5->m_stencilBits == 0) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_78,"Test requires stencil buffer",(allocator<char> *)&local_58);
      tcu::NotSupportedError::NotSupportedError(pNVar6,&sStack_78);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    RVar1 = this->m_renderTarget;
  }
  pRVar5 = (RenderTarget *)(ulong)RVar1;
  if (RVar1 == RENDERTARGET_DEFAULT) {
    pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
    if (0x1f < pRVar5->m_width) {
      pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
      if (0x1f < pRVar5->m_height) goto LAB_00461ac0;
    }
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_38,&(anonymous_namespace)::EarlyFragmentTestsCase::RENDER_SIZE);
    std::operator+(&local_58,"Render target must have at least ",&local_38);
    std::operator+(&sStack_78,&local_58," width and height");
    tcu::NotSupportedError::NotSupportedError(pNVar6,&sStack_78);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
LAB_00461ac0:
  return (int)pRVar5;
}

Assistant:

void init (void)
	{
		if (m_context.getContextInfo().getInt(GL_MAX_FRAGMENT_IMAGE_UNIFORMS) == 0)
			throw tcu::NotSupportedError("GL_MAX_FRAGMENT_IMAGE_UNIFORMS is zero");

		if (!m_context.getContextInfo().isExtensionSupported("GL_OES_shader_image_atomic") && !glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
			throw tcu::NotSupportedError("Test requires OES_shader_image_atomic extension");

		if (m_type == TESTTYPE_DEPTH				&&
			m_renderTarget == RENDERTARGET_DEFAULT	&&
			m_context.getRenderTarget().getDepthBits() == 0)
		{
			throw tcu::NotSupportedError("Test requires depth buffer");
		}

		if (m_type == TESTTYPE_STENCIL				&&
			m_renderTarget == RENDERTARGET_DEFAULT	&&
			m_context.getRenderTarget().getStencilBits() == 0)
		{
			throw tcu::NotSupportedError("Test requires stencil buffer");
		}

		if (m_renderTarget == RENDERTARGET_DEFAULT	&&
			(m_context.getRenderTarget().getWidth() < RENDER_SIZE || m_context.getRenderTarget().getHeight() < RENDER_SIZE))
			throw tcu::NotSupportedError("Render target must have at least " + toString(RENDER_SIZE) + " width and height");
	}